

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

char * path(char *s)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar2 = s;
  while( true ) {
    pcVar1 = strchr(pcVar2,0x26);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    pcVar5 = pcVar2;
    if (*pcVar2 == '<') {
      pcVar2 = strrchr(pcVar2,0x3e);
      if (pcVar2 == (char *)0x0) {
        return s;
      }
      pcVar2 = pcVar2 + 1;
      pcVar5 = pcVar2;
    }
    while (pcVar3 = strpbrk(pcVar2,"/\\"), pcVar3 != (char *)0x0) {
      pcVar2 = pcVar3 + 1;
      *pcVar3 = '/';
    }
    while( true ) {
      pcVar2 = pcVar5 + (*pcVar5 == '/');
      pcVar5 = strchr(pcVar2,0x2f);
      if (pcVar5 == (char *)0x0) break;
      if (((pcVar2 + 1 == pcVar5) && (lVar6 = 1, *pcVar2 == '.')) ||
         (((pcVar5[1] == '.' && ((pcVar5[2] == '.' && (pcVar5[3] == '/')))) &&
          ((lVar6 = 4, pcVar2 + 2 != pcVar5 || ((*pcVar2 != '.' || (pcVar2[1] != '.')))))))) {
        sVar4 = strlen(pcVar5 + lVar6);
        memmove(pcVar2,pcVar5 + lVar6,sVar4 + 1);
        pcVar5 = pcVar2;
      }
    }
    if (pcVar1 == (char *)0x0) break;
    *pcVar1 = '&';
    pcVar2 = pcVar1 + 1;
  }
  return s;
}

Assistant:

char *path(char *s)
{
    for(char *curpart = s;;)
    {
        char *endpart = strchr(curpart, '&');
        if(endpart) *endpart = '\0';
        if(curpart[0]=='<')
        {
            char *file = strrchr(curpart, '>');
            if(!file) return s;
            curpart = file+1;
        }
        for(char *t = curpart; (t = strpbrk(t, "/\\")); *t++ = PATHDIV);
        for(char *prevdir = NULL, *curdir = curpart;;)
        {
            prevdir = curdir[0]==PATHDIV ? curdir+1 : curdir;
            curdir = strchr(prevdir, PATHDIV);
            if(!curdir) break;
            if(prevdir+1==curdir && prevdir[0]=='.')
            {
                memmove(prevdir, curdir+1, strlen(curdir+1)+1);
                curdir = prevdir;
            }
            else if(curdir[1]=='.' && curdir[2]=='.' && curdir[3]==PATHDIV)
            {
                if(prevdir+2==curdir && prevdir[0]=='.' && prevdir[1]=='.') continue;
                memmove(prevdir, curdir+4, strlen(curdir+4)+1);
                curdir = prevdir;
            }
        }
        if(endpart)
        {
            *endpart = '&';
            curpart = endpart+1;
        }
        else break;
    }
    return s;
}